

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O2

ZyanStatus
ZydisDecoderDecodeFull
          (ZydisDecoder *decoder,void *buffer,ZyanUSize length,ZydisDecodedInstruction *instruction,
          ZydisDecodedOperand *operands)

{
  ZyanStatus ZVar1;
  int iVar2;
  undefined1 auVar3 [16];
  ZydisDecoderContext context;
  
  auVar3._0_4_ = -(uint)(decoder == (ZydisDecoder *)0x0);
  auVar3._4_4_ = -(uint)(instruction == (ZydisDecodedInstruction *)0x0);
  auVar3._8_4_ = -(uint)(buffer == (void *)0x0);
  auVar3._12_4_ = -(uint)(operands == (ZydisDecodedOperand *)0x0);
  iVar2 = movmskps((int)buffer,auVar3);
  ZVar1 = 0x80100004;
  if (iVar2 == 0) {
    if (length == 0) {
      ZVar1 = 0x80200000;
    }
    else {
      ZVar1 = 0x8010000d;
      if ((decoder->decoder_mode & 1) == 0) {
        ZVar1 = ZydisDecoderDecodeInstruction(decoder,&context,buffer,length,instruction);
        if (-1 < (int)ZVar1) {
          ZVar1 = ZydisDecoderDecodeOperands
                            (decoder,&context,instruction,operands,instruction->operand_count);
          if (-1 < (int)ZVar1) {
            memset(operands + instruction->operand_count,0,
                   (10 - (ulong)instruction->operand_count) * 0x50);
            ZVar1 = 0x100000;
          }
        }
      }
    }
  }
  return ZVar1;
}

Assistant:

ZyanStatus ZydisDecoderDecodeFull(const ZydisDecoder* decoder,
    const void* buffer, ZyanUSize length, ZydisDecodedInstruction* instruction,
    ZydisDecodedOperand operands[ZYDIS_MAX_OPERAND_COUNT])
{
    if (!decoder || !instruction || !buffer || !operands)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }
    if (!length)
    {
        return ZYDIS_STATUS_NO_MORE_DATA;
    }
    if (decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_MINIMAL))
    {
        return ZYAN_STATUS_MISSING_DEPENDENCY; // TODO: Introduce better status code
    }

    ZydisDecoderContext context;
    ZYAN_CHECK(ZydisDecoderDecodeInstruction(decoder, &context, buffer, length, instruction));
    ZYAN_CHECK(ZydisDecoderDecodeOperands(decoder, &context, instruction, operands,
        instruction->operand_count));
    ZYAN_MEMSET(&operands[instruction->operand_count], 0,
        (ZYDIS_MAX_OPERAND_COUNT - instruction->operand_count) * sizeof(operands[0]));

    return ZYAN_STATUS_SUCCESS;
}